

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O2

void ReleaseObject(Heap *heap,Raw object)

{
  uint *puVar1;
  uint uVar2;
  Chuck *pCVar3;
  Chuck *chuck;
  char *__assertion;
  
  puVar1 = (uint *)((long)object + (ulong)(*(uint *)((long)object + -4) >> 1) * 8 + -4);
  *puVar1 = *puVar1 & 0xfffffffe;
  chuck = (Chuck *)((long)object + -8);
  SetHigher(chuck,(Chuck *)((long)object + (ulong)(*(uint *)((long)object + -4) >> 1) * 8 + -8));
  uVar2 = *(uint *)((long)object + -4);
  if ((uVar2 & 1) == 0) {
    pCVar3 = GetLower(chuck);
    MoveOut(heap,pCVar3);
    pCVar3 = GetLower(chuck);
    SetHigher(pCVar3,(Chuck *)(&chuck->lowerSize + (ulong)(*(uint *)((long)object + -4) >> 1) * 2));
    chuck = GetLower(chuck);
    uVar2 = *(uint *)&chuck->field_0x4;
    if ((uVar2 & 1) == 0) {
      __assertion = "chuck->lowerUsed";
      uVar2 = 0x43;
      goto LAB_001029e4;
    }
  }
  pCVar3 = (Chuck *)(&chuck->lowerSize + (ulong)(uVar2 >> 1) * 2);
  if (((&pCVar3->field_0x4)[(ulong)(*(uint *)&pCVar3->field_0x4 >> 1) * 8] & 1) == 0) {
    MoveOut(heap,pCVar3);
    uVar2 = *(uint *)&chuck->field_0x4 >> 1;
    SetHigher(chuck,(Chuck *)(&chuck->lowerSize +
                             (ulong)uVar2 * 2 +
                             (ulong)(*(uint *)(&chuck->field_0x4 + (ulong)uVar2 * 8) >> 1) * 2));
    uVar2 = *(uint *)&chuck->field_0x4 >> 1;
    if (((&chuck->field_0x4)
         [(ulong)(*(uint *)(&chuck->field_0x4 + (ulong)uVar2 * 8) >> 1) * 8 + (ulong)uVar2 * 8] & 1)
        == 0) {
      __assertion = "GetUsed(GetHigher(chuck))";
      uVar2 = 0x48;
LAB_001029e4:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/Heap.c"
                    ,uVar2,"void ReleaseObject(Heap *, Raw)");
    }
  }
  MoveIn(heap,chuck);
  return;
}

Assistant:

void ReleaseObject(Heap *heap, Raw object) {
    Chuck *chuck = ToChuck(object);
    SetUsed(chuck, 0);
    SetHigher(chuck, GetHigher(chuck));
    if (!chuck->lowerUsed) {
        MoveOut(heap, GetLower(chuck));
        SetHigher(GetLower(chuck), GetHigher(chuck));
        chuck = GetLower(chuck);
        assert(chuck->lowerUsed);
    }
    if (!GetUsed(GetHigher(chuck))) {
        MoveOut(heap, GetHigher(chuck));
        SetHigher(chuck, GetHigher(GetHigher(chuck)));
        assert(GetUsed(GetHigher(chuck)));
    }
    MoveIn(heap, chuck);
}